

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

void stumpless_destroy_entry_and_contents(stumpless_entry *entry)

{
  ulong local_18;
  size_t i;
  stumpless_entry *entry_local;
  
  if (entry != (stumpless_entry *)0x0) {
    for (local_18 = 0; local_18 < entry->element_count; local_18 = local_18 + 1) {
      stumpless_destroy_element_and_contents(entry->elements[local_18]);
    }
    unchecked_destroy_entry(entry);
  }
  return;
}

Assistant:

void
stumpless_destroy_entry_and_contents( const struct stumpless_entry *entry ) {
  size_t i;

  if( !entry ) {
    return;
  }

  for( i = 0; i < entry->element_count; i++ ) {
    stumpless_destroy_element_and_contents( entry->elements[i] );
  }

  unchecked_destroy_entry( entry );
}